

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.c
# Opt level: O1

uint64_t getNumBlocks(uint64_t input_length,SkeinSize_t state_size)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (input_length != 0) {
    uVar1 = 0;
    uVar2 = state_size >> 3;
    do {
      uVar1 = uVar1 + 1;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + (state_size >> 3);
    } while (uVar3 < input_length);
    return uVar1;
  }
  return 0;
}

Assistant:

inline uint64_t getNumBlocks(const uint64_t input_length, const SkeinSize_t state_size)
{
    uint64_t blocks = 0;
    uint32_t bytes = 0;
    while(bytes < input_length)
    {
        bytes += (uint32_t) state_size/8;
        blocks++;
    }

    return blocks;
}